

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::CallI
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,ProfileId callSiteId,CallFlags callFlags)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot givenArgCount_00;
  undefined4 reg;
  bool bVar4;
  bool bVar5;
  RegSlot returnValueRegister_00;
  undefined4 *puVar6;
  undefined8 extraout_RDX;
  uint uVar7;
  undefined6 in_register_00000082;
  undefined2 local_5a;
  RegSlot local_58;
  bool local_54;
  undefined3 uStack_53;
  CallFlags local_50;
  undefined4 local_4c;
  Type local_48;
  Type local_46;
  InlineCacheIndex local_44;
  ProfileId profileId;
  ProfileId profileId2;
  CacheIdUnit unit;
  OpCode local_32;
  RegSlot functionRegister_local;
  OpCode op_local;
  
  unit.cacheId = (uint)CONCAT62(in_register_00000082,givenArgCount);
  unit._4_4_ = functionRegister;
  local_32 = op;
  CheckOpen(this);
  CheckOp(this,local_32,(OpLayoutType)((uint)(callFlags != CallFlags_None) * 3 + 0x1d));
  bVar4 = OpCodeAttr::HasMultiSizeLayout(local_32);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4e3,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar4) goto LAB_0089e713;
    *puVar6 = 0;
  }
  if (returnValueRegister == 0xffffffff) {
    returnValueRegister_00 = 0xffffffff;
  }
  else {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar4) goto LAB_0089e713;
      *puVar6 = 0;
    }
    returnValueRegister_00 = FunctionBody::MapRegSlot(this->m_functionWrite,returnValueRegister);
  }
  reg = unit._4_4_;
  if (unit._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar4) {
      *puVar6 = 0;
      Throw::InternalError();
    }
    goto LAB_0089e713;
  }
  if (this->m_functionWrite == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar4) goto LAB_0089e713;
    *puVar6 = 0;
  }
  unit._4_4_ = FunctionBody::MapRegSlot(this->m_functionWrite,reg);
  local_46 = 0xffff;
  local_44 = 0xffffffff;
  local_48 = callSiteId;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove
            (this->callRegToLdFldCacheIndexMap,(uint *)&unit.isRootObjectCache,
             (CacheIdUnit *)&stack0xffffffffffffffbc);
  if ((ushort)(local_32 - CallI) < 4) {
    bVar4 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((callSiteId == 0xffff) || (!bVar4)) {
      bVar4 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      if ((!bVar4) &&
         (bVar4 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite), !bVar4))
      goto LAB_0089e36c;
      TVar1 = this->m_functionWrite->profiledReturnTypeCount;
      if (TVar1 == 0xffff) goto LAB_0089e36c;
      this->m_functionWrite->profiledReturnTypeCount = TVar1 + 1;
      local_48 = TVar1;
      local_32 = OpCodeUtil::ConvertCallOpToProfiledReturnType(local_32);
LAB_0089e3bc:
      bVar4 = false;
    }
    else {
      bVar4 = local_44 != 0xffffffff;
      local_32 = OpCodeUtil::ConvertCallOpToProfiled(local_32,bVar4);
    }
    bVar3 = true;
    local_4c = 0;
  }
  else {
    bVar4 = DoProfileNewScObjArrayOp(this,local_32);
    if (bVar4) {
      bVar4 = DynamicProfileInfo::IsEnabled(NativeArrayPhase,this->m_functionWrite);
      if (!bVar4) {
        bVar4 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if ((callSiteId != 0xffff) && (bVar4)) goto LAB_0089e30d;
        goto LAB_0089e33c;
      }
      if (callSiteId == 0xffff) goto LAB_0089e33c;
LAB_0089e30d:
      TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
      if (TVar1 == 0xffff) goto LAB_0089e33c;
      this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
      local_46 = TVar1;
      OpCodeUtil::ConvertNonCallOpToProfiled(&local_32);
      local_4c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      bVar4 = false;
LAB_0089e3ae:
      bVar3 = true;
    }
    else {
LAB_0089e33c:
      bVar4 = DoProfileNewScObjectOp(this,local_32);
      if (bVar4) {
        bVar4 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if (bVar4) {
          if (callSiteId != 0xffff) {
LAB_0089e39a:
            if (local_44 == 0xffffffff) {
              OpCodeUtil::ConvertNonCallOpToProfiled(&local_32);
              goto LAB_0089e3bc;
            }
            OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex(&local_32);
            bVar4 = true;
            local_4c = 0;
            goto LAB_0089e3ae;
          }
        }
        else {
          bVar5 = DynamicProfileInfo::IsEnabled(FixedNewObjPhase,this->m_functionWrite);
          bVar4 = false;
          if (callSiteId != 0xffff) {
            local_4c = 0;
            bVar3 = false;
            if (bVar5) goto LAB_0089e39a;
            goto LAB_0089e3c4;
          }
        }
      }
LAB_0089e36c:
      bVar4 = false;
      local_4c = 0;
      bVar3 = false;
    }
  }
LAB_0089e3c4:
  givenArgCount_00 = (ArgSlot)unit.cacheId;
  if (bVar4) {
    if (callFlags == CallFlags_None) {
      bVar4 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,local_32,returnValueRegister_00,unit._4_4_,(ArgSlot)unit.cacheId,
                         local_44,(bool)(undefined1)profileId);
      if (((bVar4) ||
          (bVar4 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                             (this,local_32,returnValueRegister_00,unit._4_4_,givenArgCount_00,
                              local_44,(bool)(undefined1)profileId), bVar4)) ||
         (bVar4 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                            (this,local_32,returnValueRegister_00,unit._4_4_,givenArgCount_00,
                             local_44,(bool)(undefined1)profileId), bVar4)) goto LAB_0089e67e;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      uVar7 = 0x52d;
    }
    else {
      bVar4 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,local_32,returnValueRegister_00,unit._4_4_,(ArgSlot)unit.cacheId,
                         local_44,(bool)(undefined1)profileId,callFlags);
      if (((bVar4) ||
          (bVar4 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                             (this,local_32,returnValueRegister_00,unit._4_4_,givenArgCount_00,
                              local_44,(bool)(undefined1)profileId,callFlags), bVar4)) ||
         (bVar4 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                            (this,local_32,returnValueRegister_00,unit._4_4_,givenArgCount_00,
                             local_44,(bool)(undefined1)profileId,callFlags), bVar4))
      goto LAB_0089e67e;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      uVar7 = 0x529;
    }
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,uVar7,"(success)","success");
    if (!bVar4) {
LAB_0089e713:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  else {
    if (callFlags == CallFlags_None) {
      bVar4 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,local_32,returnValueRegister_00,unit._4_4_,(ArgSlot)unit.cacheId);
      if ((bVar4) ||
         (bVar4 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,local_32,returnValueRegister_00,unit._4_4_,givenArgCount_00),
         bVar4)) goto LAB_0089e67e;
      local_54 = unit.isRootObjectCache;
      uStack_53 = unit._5_3_;
      local_5a = (undefined2)unit.cacheId;
      local_58 = returnValueRegister_00;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32,this);
      uVar7 = 10;
    }
    else {
      bVar4 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,local_32,returnValueRegister_00,unit._4_4_,(ArgSlot)unit.cacheId,
                         callFlags);
      if ((bVar4) ||
         (bVar4 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,local_32,returnValueRegister_00,unit._4_4_,givenArgCount_00,
                             callFlags), bVar4)) goto LAB_0089e67e;
      local_54 = unit.isRootObjectCache;
      uStack_53 = unit._5_3_;
      local_5a = (undefined2)unit.cacheId;
      local_50 = callFlags;
      local_58 = returnValueRegister_00;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32,this);
      uVar7 = 0xe;
    }
    Data::Write(&this->m_byteCodeData,&local_5a,uVar7);
  }
LAB_0089e67e:
  if (bVar3) {
    Data::Write(&this->m_byteCodeData,&local_48,2);
    if ((char)local_4c != '\0') {
      Data::Write(&this->m_byteCodeData,&local_46,2);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::CallI(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();

        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags == true)
        {
            CheckOp(op, OpLayoutType::CallIFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallI);
        }

        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        bool isProfiled = false;
        bool isProfiled2 = false;
        bool isCallWithICIndex = false;
        ProfileId profileId = callSiteId;
        ProfileId profileId2 = Constants::NoProfileId;

        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);
        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
                {
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                }
                else
                {
                    isCallWithICIndex = true;
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op, true);
                }
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) &&
            (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            else
            {
                isCallWithICIndex = true;
                OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex(op);
            }
            isProfiled = true;
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlags, op, returnValueRegister, functionRegister, givenArgCount, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallI, op, returnValueRegister, functionRegister, givenArgCount);
            }
        }
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }